

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O1

size_t BrotliZopfliComputeShortestPath
                 (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
                 size_t ringbuffer_mask,BrotliEncoderParams *params,size_t max_backward_limit,
                 int *dist_cache,H10 *hasher,ZopfliNode *nodes)

{
  uint32_t *puVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint8_t *puVar6;
  size_t sVar7;
  ulong uVar8;
  size_t sVar9;
  uint uVar10;
  uint *puVar11;
  uint uVar12;
  float *pfVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  size_t sVar17;
  ulong uVar18;
  ulong uVar19;
  BackwardMatch *pBVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  uint8_t *puVar29;
  uint8_t *puVar30;
  ulong uVar31;
  ulong uVar32;
  ulong local_1998;
  ulong local_1990;
  ulong local_1970;
  ulong local_1950;
  ulong local_1918;
  uint32_t local_1908 [38];
  StartPosQueue queue;
  BackwardMatch matches [128];
  ZopfliCostModel model;
  
  uVar12 = 0x145;
  if (params->quality < 0xb) {
    uVar12 = 0x96;
  }
  model.literal_costs_ = (float *)0x0;
  pfVar13 = (float *)(num_bytes - 0x7f);
  if (num_bytes < 0x7f) {
    pfVar13 = model.literal_costs_;
  }
  nodes->length = 0;
  (nodes->u).cost = 0.0;
  model.num_bytes_ = num_bytes;
  if (num_bytes + 2 != 0) {
    model.literal_costs_ = (float *)BrotliAllocate(m,(num_bytes + 2) * 4);
  }
  ZopfliCostModelSetFromLiteralCosts(&model,position,ringbuffer,ringbuffer_mask);
  queue.idx_ = 0;
  if (3 < num_bytes) {
    sVar9 = 0;
    do {
      uVar18 = sVar9 + position;
      sVar17 = max_backward_limit;
      if (uVar18 < max_backward_limit) {
        sVar17 = uVar18;
      }
      uVar19 = num_bytes - sVar9;
      uVar14 = uVar18 & ringbuffer_mask;
      uVar5 = 0x10;
      if (params->quality == 0xb) {
        uVar5 = 0x40;
      }
      uVar23 = 0;
      if (uVar5 <= uVar18) {
        uVar23 = uVar18 - uVar5;
      }
      puVar6 = ringbuffer + uVar14;
      uVar8 = (ulong)((uint)uVar19 & 7);
      uVar25 = 1;
      pBVar20 = matches;
      uVar5 = uVar18;
      do {
        uVar5 = uVar5 - 1;
        if ((uVar5 <= uVar23) || (2 < uVar25)) break;
        uVar24 = uVar18 - uVar5;
        if ((uVar24 <= sVar17) &&
           ((uVar15 = uVar5 & ringbuffer_mask, *puVar6 == ringbuffer[uVar15] &&
            (puVar6[1] == ringbuffer[uVar15 + 1])))) {
          if (7 < uVar19) {
            lVar28 = 0;
            uVar31 = 0;
LAB_0010daa6:
            if (*(ulong *)(puVar6 + uVar31 * 8) == *(ulong *)(ringbuffer + uVar31 * 8 + uVar15))
            goto code_r0x0010dab3;
            uVar31 = *(ulong *)(ringbuffer + uVar31 * 8 + uVar15) ^ *(ulong *)(puVar6 + uVar31 * 8);
            uVar15 = 0;
            if (uVar31 != 0) {
              for (; (uVar31 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar31 = (uVar15 >> 3 & 0x1fffffff) - lVar28;
            goto LAB_0010dafb;
          }
          puVar29 = puVar6;
          uVar32 = 0;
LAB_0010db23:
          uVar31 = uVar32;
          if (uVar8 != 0) {
            uVar26 = uVar8 | uVar32;
            uVar27 = uVar8;
            do {
              uVar31 = uVar32;
              if (ringbuffer[uVar32 + uVar15] != *puVar29) break;
              puVar29 = puVar29 + 1;
              uVar32 = uVar32 + 1;
              uVar27 = uVar27 - 1;
              uVar31 = uVar26;
            } while (uVar27 != 0);
          }
LAB_0010dafb:
          if (uVar25 < uVar31) {
            pBVar20->distance = (uint32_t)uVar24;
            pBVar20->length_and_code = (int)uVar31 << 5;
            pBVar20 = pBVar20 + 1;
            uVar25 = uVar31;
          }
        }
      } while (uVar24 <= sVar17);
      if (uVar25 < uVar19) {
        uVar3 = (uint)(*(int *)(ringbuffer + uVar14) * 0x1e35a7bd) >> 0xf;
        uVar23 = (ulong)hasher->buckets_[uVar3];
        uVar5 = uVar19;
        if (0x7f < uVar19) {
          hasher->buckets_[uVar3] = (uint32_t)uVar18;
          uVar5 = 0x80;
        }
        puVar6 = ringbuffer + uVar14;
        uVar8 = hasher->window_mask_;
        lVar28 = (uVar8 & uVar18) * 2 + 1;
        lVar22 = (uVar8 & uVar18) * 2;
        lVar16 = 0x40;
        local_1950 = 0;
        local_1918 = 0;
LAB_0010dbf5:
        uVar24 = uVar18 - uVar23;
        if ((uVar24 != 0) && (lVar16 != 0 && uVar24 <= sVar17)) {
          uVar15 = local_1918;
          if (local_1950 < local_1918) {
            uVar15 = local_1950;
          }
          if (0x80 < uVar15) {
LAB_0010e5bc:
            __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                          ,0x9d,
                          "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                         );
          }
          puVar30 = ringbuffer + (uVar23 & ringbuffer_mask);
          puVar29 = puVar30 + uVar15;
          uVar31 = uVar19 - uVar15;
          if (7 < uVar31) {
            uVar27 = uVar31 & 0xfffffffffffffff8;
            lVar21 = 0;
            uVar32 = 0;
LAB_0010dcb5:
            if (*(ulong *)(puVar29 + uVar32 * 8) == *(ulong *)(puVar6 + uVar32 * 8 + uVar15))
            goto code_r0x0010dcc2;
            uVar32 = *(ulong *)(puVar6 + uVar32 * 8 + uVar15) ^ *(ulong *)(puVar29 + uVar32 * 8);
            uVar31 = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
              }
            }
            uVar32 = (uVar31 >> 3 & 0x1fffffff) - lVar21;
            goto LAB_0010dce4;
          }
          uVar27 = 0;
          goto LAB_0010de13;
        }
        if (0x7f < uVar19) {
          puVar1 = hasher->forest_;
          puVar1[lVar22] = hasher->invalid_pos_;
          puVar1[lVar28] = hasher->invalid_pos_;
        }
        bVar2 = false;
        goto LAB_0010de03;
      }
LAB_0010de4b:
      lVar28 = 0;
      do {
        local_1908[lVar28] = 0xfffffff;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 0x26);
      uVar25 = uVar25 + 1;
      if (uVar25 < 5) {
        uVar25 = 4;
      }
      iVar4 = BrotliFindAllStaticDictionaryMatches(ringbuffer + uVar14,uVar25,uVar19,local_1908);
      if (iVar4 != 0) {
        if (0x24 < uVar19) {
          uVar19 = 0x25;
        }
        if (uVar25 <= uVar19) {
          iVar4 = (int)uVar25 << 5;
          do {
            uVar3 = local_1908[uVar25];
            if (uVar3 < 0xfffffff) {
              uVar10 = uVar3 & 0x1f;
              pBVar20->distance = (uVar3 >> 5) + (int)sVar17 + 1;
              if (uVar25 == uVar10) {
                uVar10 = 0;
              }
              pBVar20->length_and_code = uVar10 + iVar4;
              pBVar20 = pBVar20 + 1;
            }
            uVar25 = uVar25 + 1;
            iVar4 = iVar4 + 0x20;
          } while (uVar19 + 1 != uVar25);
        }
      }
      if ((long)pBVar20 - (long)matches == 0) {
        sVar17 = 0;
      }
      else {
        sVar17 = (long)pBVar20 - (long)matches >> 3;
        if (uVar12 < pBVar20[-1].length_and_code >> 5) {
          matches[0] = matches[sVar17 - 1];
          sVar17 = 1;
        }
      }
      sVar7 = UpdateNodes(num_bytes,position,sVar9,ringbuffer,ringbuffer_mask,params,
                          max_backward_limit,dist_cache,sVar17,matches,&model,&queue,nodes);
      uVar5 = 0;
      if (0x3fff < sVar7) {
        uVar5 = sVar7;
      }
      if (sVar17 == 1) {
        uVar3 = matches[0].length_and_code >> 5;
        if ((uVar12 < uVar3) && (uVar5 < uVar3)) {
          uVar5 = (ulong)uVar3;
        }
      }
      sVar17 = sVar9;
      if (1 < uVar5) {
        uVar19 = uVar18 + 1;
        uVar14 = uVar5 + uVar18;
        if ((long)pfVar13 + position <= uVar5 + uVar18) {
          uVar14 = (long)pfVar13 + position;
        }
        uVar23 = uVar14 - 0x3f;
        if (uVar14 < uVar18 + 0x40) {
          uVar23 = uVar19;
        }
        if ((uVar18 + 0x201 <= uVar23) && (uVar19 < uVar23)) {
          uVar18 = hasher->window_mask_;
LAB_0010e05b:
          puVar6 = ringbuffer + (uVar19 & ringbuffer_mask);
          uVar3 = (uint)(*(int *)(ringbuffer + (uVar19 & ringbuffer_mask)) * 0x1e35a7bd) >> 0xf;
          uVar24 = (ulong)hasher->buckets_[uVar3];
          uVar25 = (uVar18 & uVar19) * 2 + 1;
          uVar8 = (uVar18 & uVar19) * 2;
          hasher->buckets_[uVar3] = (uint32_t)uVar19;
          lVar28 = 0x40;
          local_1998 = 0;
          local_1970 = 0;
LAB_0010e0aa:
          if ((uVar19 == uVar24) || (lVar28 == 0 || uVar18 - 0xf < uVar19 - uVar24)) {
            puVar1 = hasher->forest_;
            puVar1[uVar8] = hasher->invalid_pos_;
            puVar1[uVar25] = hasher->invalid_pos_;
            bVar2 = false;
            goto LAB_0010e0e1;
          }
          uVar15 = local_1970;
          if (local_1998 < local_1970) {
            uVar15 = local_1998;
          }
          if (uVar15 < 0x81) {
            puVar30 = ringbuffer + (uVar24 & ringbuffer_mask);
            puVar29 = puVar30 + uVar15;
            uVar31 = 0x80 - uVar15;
            if (7 < uVar31) {
              uVar27 = uVar31 & 0xfffffffffffffff8;
              lVar22 = 0;
              uVar32 = 0;
LAB_0010e14a:
              if (*(ulong *)(puVar29 + uVar32 * 8) == *(ulong *)(puVar6 + uVar32 * 8 + uVar15))
              goto code_r0x0010e157;
              uVar32 = *(ulong *)(puVar6 + uVar32 * 8 + uVar15) ^ *(ulong *)(puVar29 + uVar32 * 8);
              uVar31 = 0;
              if (uVar32 != 0) {
                for (; (uVar32 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              uVar32 = (uVar31 >> 3 & 0x1fffffff) - lVar22;
              goto LAB_0010e179;
            }
            uVar27 = 0;
            goto LAB_0010e265;
          }
          goto LAB_0010e5bc;
        }
LAB_0010e2a2:
        if (uVar23 < uVar14) {
          uVar18 = hasher->window_mask_;
LAB_0010e2be:
          puVar6 = ringbuffer + (uVar23 & ringbuffer_mask);
          uVar3 = (uint)(*(int *)(ringbuffer + (uVar23 & ringbuffer_mask)) * 0x1e35a7bd) >> 0xf;
          uVar8 = (ulong)hasher->buckets_[uVar3];
          uVar19 = (uVar18 & uVar23) * 2 + 1;
          uVar25 = (uVar18 & uVar23) * 2;
          hasher->buckets_[uVar3] = (uint32_t)uVar23;
          lVar28 = 0x40;
          local_1990 = 0;
          local_1998 = 0;
LAB_0010e311:
          if ((uVar23 == uVar8) || (lVar28 == 0 || uVar18 - 0xf < uVar23 - uVar8)) {
            puVar1 = hasher->forest_;
            puVar1[uVar25] = hasher->invalid_pos_;
            puVar1[uVar19] = hasher->invalid_pos_;
            bVar2 = false;
            goto LAB_0010e348;
          }
          uVar24 = local_1998;
          if (local_1990 < local_1998) {
            uVar24 = local_1990;
          }
          if (uVar24 < 0x81) {
            puVar30 = ringbuffer + (uVar8 & ringbuffer_mask);
            puVar29 = puVar30 + uVar24;
            uVar15 = 0x80 - uVar24;
            if (7 < uVar15) {
              uVar32 = uVar15 & 0xfffffffffffffff8;
              lVar22 = 0;
              uVar31 = 0;
LAB_0010e3ac:
              if (*(ulong *)(puVar29 + uVar31 * 8) == *(ulong *)(puVar6 + uVar31 * 8 + uVar24))
              goto code_r0x0010e3b9;
              uVar31 = *(ulong *)(puVar6 + uVar31 * 8 + uVar24) ^ *(ulong *)(puVar29 + uVar31 * 8);
              uVar15 = 0;
              if (uVar31 != 0) {
                for (; (uVar31 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                }
              }
              uVar31 = (uVar15 >> 3 & 0x1fffffff) - lVar22;
              goto LAB_0010e3db;
            }
            uVar32 = 0;
            goto LAB_0010e4ac;
          }
          goto LAB_0010e5bc;
        }
LAB_0010e4ea:
        lVar28 = uVar5 - 1;
        if (lVar28 != 0) {
          uVar18 = sVar9 + 4;
          do {
            sVar17 = uVar18 - 3;
            if (num_bytes <= uVar18) break;
            EvaluateNode(position,sVar17,max_backward_limit,dist_cache,&model,&queue,nodes);
            uVar18 = uVar18 + 1;
            lVar28 = lVar28 + -1;
          } while (lVar28 != 0);
        }
      }
      sVar9 = sVar17 + 1;
    } while (sVar17 + 4 < num_bytes);
  }
  BrotliFree(m,model.literal_costs_);
  model.literal_costs_ = (float *)0x0;
  sVar9 = ComputeShortestPathFromNodes(num_bytes,nodes);
  return sVar9;
code_r0x0010dab3:
  uVar31 = uVar31 + 1;
  lVar28 = lVar28 + -8;
  puVar29 = puVar6 + (uVar19 & 0xfffffffffffffff8);
  uVar32 = uVar19 & 0xfffffffffffffff8;
  if (uVar19 >> 3 == uVar31) goto LAB_0010db23;
  goto LAB_0010daa6;
code_r0x0010dcc2:
  uVar32 = uVar32 + 1;
  lVar21 = lVar21 + -8;
  if (uVar31 >> 3 == uVar32) goto code_r0x0010dcce;
  goto LAB_0010dcb5;
code_r0x0010dcce:
  puVar29 = puVar29 + -lVar21;
LAB_0010de13:
  uVar31 = uVar31 & 7;
  uVar32 = uVar27;
  if (uVar31 != 0) {
    uVar26 = uVar27 | uVar31;
    do {
      uVar32 = uVar27;
      if (puVar6[uVar27 + uVar15] != *puVar29) break;
      puVar29 = puVar29 + 1;
      uVar27 = uVar27 + 1;
      uVar31 = uVar31 - 1;
      uVar32 = uVar26;
    } while (uVar31 != 0);
  }
LAB_0010dce4:
  uVar32 = uVar32 + uVar15;
  iVar4 = bcmp(puVar6,puVar30,uVar32);
  if (iVar4 != 0) {
LAB_0010e5db:
    __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                  ,0xa2,
                  "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                 );
  }
  if (pBVar20 == (BackwardMatch *)0x0) {
    pBVar20 = (BackwardMatch *)0x0;
  }
  else if (uVar25 < uVar32) {
    pBVar20->distance = (uint32_t)uVar24;
    pBVar20->length_and_code = (int)uVar32 << 5;
    pBVar20 = pBVar20 + 1;
    uVar25 = uVar32;
  }
  if (uVar32 < uVar5) {
    if (puVar30[uVar32] < puVar6[uVar32]) {
      if (0x7f < uVar19) {
        hasher->forest_[lVar22] = (uint32_t)uVar23;
      }
      lVar22 = (uVar23 & uVar8) * 2 + 1;
      lVar21 = lVar22;
      local_1950 = uVar32;
    }
    else {
      if (0x7f < uVar19) {
        hasher->forest_[lVar28] = (uint32_t)uVar23;
      }
      lVar28 = (uVar23 & uVar8) * 2;
      lVar21 = lVar28;
      local_1918 = uVar32;
    }
    uVar23 = (ulong)hasher->forest_[lVar21];
    bVar2 = true;
  }
  else {
    if (0x7f < uVar19) {
      puVar1 = hasher->forest_;
      puVar1[lVar22] = puVar1[(uVar23 & uVar8) * 2];
      puVar1[lVar28] = puVar1[(uVar23 & uVar8) * 2 + 1];
    }
    bVar2 = false;
  }
LAB_0010de03:
  lVar16 = lVar16 + -1;
  if (!bVar2) goto LAB_0010de4b;
  goto LAB_0010dbf5;
code_r0x0010e157:
  uVar32 = uVar32 + 1;
  lVar22 = lVar22 + -8;
  if (uVar31 >> 3 == uVar32) goto code_r0x0010e163;
  goto LAB_0010e14a;
code_r0x0010e163:
  puVar29 = puVar29 + -lVar22;
LAB_0010e265:
  uVar31 = uVar31 & 7;
  uVar32 = uVar27;
  if (uVar31 != 0) {
    uVar26 = uVar27 | uVar31;
    do {
      uVar32 = uVar27;
      if (puVar6[uVar27 + uVar15] != *puVar29) break;
      puVar29 = puVar29 + 1;
      uVar27 = uVar27 + 1;
      uVar31 = uVar31 - 1;
      uVar32 = uVar26;
    } while (uVar31 != 0);
  }
LAB_0010e179:
  uVar32 = uVar32 + uVar15;
  iVar4 = bcmp(puVar6,puVar30,uVar32);
  if (iVar4 != 0) goto LAB_0010e5db;
  if (uVar32 < 0x80) {
    uVar31 = uVar24 & uVar18;
    uVar15 = uVar31 * 2;
    if (puVar30[uVar32] < puVar6[uVar32]) {
      puVar1 = hasher->forest_;
      puVar1[uVar8] = (uint32_t)uVar24;
      puVar11 = puVar1 + uVar31 * 2 + 1;
      uVar8 = uVar15 | 1;
      uVar15 = uVar25;
      local_1998 = uVar32;
    }
    else {
      puVar1 = hasher->forest_;
      puVar1[uVar25] = (uint32_t)uVar24;
      puVar11 = puVar1 + uVar31 * 2;
      local_1970 = uVar32;
    }
    uVar24 = (ulong)*puVar11;
    bVar2 = true;
    uVar25 = uVar15;
  }
  else {
    puVar1 = hasher->forest_;
    puVar1[uVar8] = puVar1[(uVar24 & uVar18) * 2];
    puVar1[uVar25] = puVar1[(uVar24 & uVar18) * 2 + 1];
    bVar2 = false;
  }
LAB_0010e0e1:
  lVar28 = lVar28 + -1;
  if (!bVar2) goto LAB_0010e295;
  goto LAB_0010e0aa;
LAB_0010e295:
  uVar19 = uVar19 + 8;
  if (uVar23 <= uVar19) goto LAB_0010e2a2;
  goto LAB_0010e05b;
code_r0x0010e3b9:
  uVar31 = uVar31 + 1;
  lVar22 = lVar22 + -8;
  if (uVar15 >> 3 == uVar31) goto code_r0x0010e3c5;
  goto LAB_0010e3ac;
code_r0x0010e3c5:
  puVar29 = puVar29 + -lVar22;
LAB_0010e4ac:
  uVar15 = uVar15 & 7;
  uVar31 = uVar32;
  if (uVar15 != 0) {
    uVar27 = uVar32 | uVar15;
    do {
      uVar31 = uVar32;
      if (puVar6[uVar32 + uVar24] != *puVar29) break;
      puVar29 = puVar29 + 1;
      uVar32 = uVar32 + 1;
      uVar15 = uVar15 - 1;
      uVar31 = uVar27;
    } while (uVar15 != 0);
  }
LAB_0010e3db:
  uVar31 = uVar31 + uVar24;
  iVar4 = bcmp(puVar6,puVar30,uVar31);
  if (iVar4 != 0) goto LAB_0010e5db;
  if (uVar31 < 0x80) {
    uVar15 = uVar8 & uVar18;
    uVar24 = uVar15 * 2;
    if (puVar30[uVar31] < puVar6[uVar31]) {
      puVar1 = hasher->forest_;
      puVar1[uVar25] = (uint32_t)uVar8;
      puVar11 = puVar1 + uVar15 * 2 + 1;
      uVar25 = uVar24 | 1;
      uVar24 = uVar19;
      local_1990 = uVar31;
    }
    else {
      puVar1 = hasher->forest_;
      puVar1[uVar19] = (uint32_t)uVar8;
      puVar11 = puVar1 + uVar15 * 2;
      local_1998 = uVar31;
    }
    uVar8 = (ulong)*puVar11;
    bVar2 = true;
    uVar19 = uVar24;
  }
  else {
    puVar1 = hasher->forest_;
    puVar1[uVar25] = puVar1[(uVar8 & uVar18) * 2];
    puVar1[uVar19] = puVar1[(uVar8 & uVar18) * 2 + 1];
    bVar2 = false;
  }
LAB_0010e348:
  lVar28 = lVar28 + -1;
  if (!bVar2) goto LAB_0010e4dc;
  goto LAB_0010e311;
LAB_0010e4dc:
  uVar23 = uVar23 + 1;
  if (uVar14 <= uVar23) goto LAB_0010e4ea;
  goto LAB_0010e2be;
}

Assistant:

size_t BrotliZopfliComputeShortestPath(MemoryManager* m,
                                       size_t num_bytes,
                                       size_t position,
                                       const uint8_t* ringbuffer,
                                       size_t ringbuffer_mask,
                                       const BrotliEncoderParams* params,
                                       const size_t max_backward_limit,
                                       const int* dist_cache,
                                       H10* hasher,
                                       ZopfliNode* nodes) {
  const size_t max_zopfli_len = MaxZopfliLen(params);
  ZopfliCostModel model;
  StartPosQueue queue;
  BackwardMatch matches[MAX_NUM_MATCHES_H10];
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t i;
  nodes[0].length = 0;
  nodes[0].u.cost = 0;
  InitZopfliCostModel(m, &model, num_bytes);
  if (BROTLI_IS_OOM(m)) return 0;
  ZopfliCostModelSetFromLiteralCosts(
      &model, position, ringbuffer, ringbuffer_mask);
  InitStartPosQueue(&queue);
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; i++) {
    const size_t pos = position + i;
    const size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t num_matches = FindAllMatchesH10(hasher, ringbuffer, ringbuffer_mask,
        pos, num_bytes - i, max_distance, params, matches);
    size_t skip;
    if (num_matches > 0 &&
        BackwardMatchLength(&matches[num_matches - 1]) > max_zopfli_len) {
      matches[0] = matches[num_matches - 1];
      num_matches = 1;
    }
    skip = UpdateNodes(num_bytes, position, i, ringbuffer, ringbuffer_mask,
        params, max_backward_limit, dist_cache, num_matches, matches, &model,
        &queue, nodes);
    if (skip < BROTLI_LONG_COPY_QUICK_STEP) skip = 0;
    if (num_matches == 1 && BackwardMatchLength(&matches[0]) > max_zopfli_len) {
      skip = BROTLI_MAX(size_t, BackwardMatchLength(&matches[0]), skip);
    }
    if (skip > 1) {
      /* Add the tail of the copy to the hasher. */
      StoreRangeH10(hasher, ringbuffer, ringbuffer_mask, pos + 1, BROTLI_MIN(
          size_t, pos + skip, store_end));
      skip--;
      while (skip) {
        i++;
        if (i + HashTypeLengthH10() - 1 >= num_bytes) break;
        EvaluateNode(
            position, i, max_backward_limit, dist_cache, &model, &queue, nodes);
        skip--;
      }
    }
  }
  CleanupZopfliCostModel(m, &model);
  return ComputeShortestPathFromNodes(num_bytes, nodes);
}